

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O0

void testApproxL2<makeTests(TasGrid::TypeAcceleration,int)::__16>
               (double param_1,TasmanianSparseGrid *grid,undefined4 param_3)

{
  allocator<double> *this;
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  ostream *poVar2;
  runtime_error *this_00;
  double err;
  vector<double,_std::allocator<double>_> surrogate;
  undefined1 local_100 [8];
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  data;
  double local_c8 [4];
  iterator local_a8;
  size_type local_a0;
  vector<double,_std::allocator<double>_> local_98;
  allocator<double> local_69;
  double local_68 [3];
  iterator local_50;
  size_type local_48;
  vector<double,_std::allocator<double>_> local_40;
  double local_28;
  double tolerance_local;
  TasmanianSparseGrid *pTStack_18;
  int num_samples_local;
  TasmanianSparseGrid *grid_local;
  
  local_68[2] = -0.5;
  local_68[0] = -0.5;
  local_68[1] = -0.5;
  local_50 = local_68;
  local_48 = 3;
  local_28 = param_1;
  tolerance_local._4_4_ = param_3;
  pTStack_18 = grid;
  std::allocator<double>::allocator(&local_69);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__l_00,&local_69);
  local_c8[0] = 0.7;
  local_c8[1] = 0.7;
  local_c8[2] = 0.7;
  local_a8 = local_c8;
  local_a0 = 3;
  this = (allocator<double> *)
         ((long)&data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l,this);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_40);
  std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&data.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  std::allocator<double>::~allocator(&local_69);
  generateRandomData<makeTests(TasGrid::TypeAcceleration,int)::__16>
            ((vector<double,_std::allocator<double>_> *)local_100,pTStack_18,tolerance_local._4_4_);
  TasGrid::loadUnstructuredDataL2
            ((vector<double,_std::allocator<double>_> *)local_100,
             (vector<double,_std::allocator<double>_> *)
             &data.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1e-08,pTStack_18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&err);
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)pTStack_18,(vector *)local_100);
  dVar1 = vecDifference((vector<double,_std::allocator<double>_> *)
                        &data.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (vector<double,_std::allocator<double>_> *)&err);
  if (local_28 < dVar1) {
    std::ostream::operator<<(&std::cout,std::scientific);
    std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),10);
    std::operator<<((ostream *)&std::cout,"Failed approximate unstructured construction\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"Observed error: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1);
    poVar2 = std::operator<<(poVar2,"  tolerance: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
    std::operator<<(poVar2,"\n");
    TasGrid::TasmanianSparseGrid::printStats((ostream *)pTStack_18);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"test failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&err);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~pair((pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *)local_100);
  return;
}

Assistant:

void testApproxL2(TasmanianSparseGrid &&grid, CallableModel model, int num_samples, double tolerance){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});

    auto data = generateRandomData(grid, model, num_samples);
    loadUnstructuredDataL2(data.first, data.second, 1.E-8, grid);

    std::vector<double> surrogate;
    grid.evaluateBatch(data.first, surrogate);

    double err = vecDifference(data.second, surrogate);
    if (err > tolerance){
        std::cout << std::scientific;
        std::cout.precision(10);
        cout << "Failed approximate unstructured construction\n";
        cout << "Observed error: " << err << "  tolerance: " << tolerance << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}